

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

void __thiscall
ear::QuadRegion::QuadRegion(QuadRegion *this,VectorXi *outputChannels,MatrixXd *positions)

{
  MatrixTypeNested __ptr;
  int *piVar1;
  long lVar2;
  QuadRegion *pQVar3;
  Matrix3d *pMVar4;
  Matrix3d *pMVar5;
  byte bVar6;
  MatrixXd reorderedPositions;
  MatrixXd reorderedAndShiftedPositions;
  DenseStorage<int,__1,__1,_1,_0> local_108;
  undefined1 local_f8 [72];
  undefined1 local_b0 [72];
  Matrix3d local_68;
  
  bVar6 = 0;
  Eigen::DenseStorage<int,_-1,_-1,_1,_0>::DenseStorage
            (&local_108,(DenseStorage<int,__1,__1,_1,_0> *)outputChannels);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_b0 + 0x30),
             (DenseStorage<double,__1,__1,__1,_0> *)positions);
  RegionHandler::RegionHandler
            (&this->super_RegionHandler,(VectorXi *)&local_108,(MatrixXd *)(local_b0 + 0x30));
  free((void *)local_b0._48_8_);
  free(local_108.m_data);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_00210910;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)0x0;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_b0 + 0x18),
             (DenseStorage<double,__1,__1,__1,_0> *)positions);
  ngonVertexOrder((ear *)&local_68,(MatrixXd *)(local_b0 + 0x18));
  __ptr = (MatrixTypeNested)
          (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
          m_data;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[0];
  piVar1 = (int *)(this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows;
  (this->_order).super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
              .array[1];
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)__ptr;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)piVar1;
  free(__ptr);
  free((void *)local_b0._24_8_);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator()
            ((type *)&local_68,positions,&this->_order,(all_t *)&Eigen::all);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::internal::AllRange<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_f8,
             (DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_Eigen::internal::AllRange<_1>_>_>
              *)&local_68);
  free((void *)local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[1]);
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       4.24399158242461e-314;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       (double)local_f8._16_8_;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_f8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::IndexedView<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<int,4,1,0,4,1>,Eigen::internal::AllRange<_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_b0,
             (DenseBase<Eigen::IndexedView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_Eigen::internal::AllRange<_1>_>_>
              *)&local_68);
  pQVar3 = (QuadRegion *)local_f8;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_f8 + 0x30),
             (DenseStorage<double,__1,__1,__1,_0> *)pQVar3);
  _calcPolyBasis(&local_68,pQVar3,(MatrixXd *)(local_f8 + 0x30));
  pMVar4 = &local_68;
  pMVar5 = &this->_polyBasisX;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  free((void *)local_f8._48_8_);
  pQVar3 = (QuadRegion *)local_b0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_f8 + 0x18),
             (DenseStorage<double,__1,__1,__1,_0> *)pQVar3);
  _calcPolyBasis(&local_68,pQVar3,(MatrixXd *)(local_f8 + 0x18));
  pMVar4 = &local_68;
  pMVar5 = &this->_polyBasisY;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
         = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
    pMVar4 = (Matrix3d *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pMVar5 = (Matrix3d *)((long)pMVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  free((void *)local_f8._24_8_);
  free((void *)local_b0._0_8_);
  free((void *)local_f8._0_8_);
  return;
}

Assistant:

QuadRegion::QuadRegion(Eigen::VectorXi outputChannels,
                         Eigen::MatrixXd positions)
      : RegionHandler(outputChannels, positions) {
    _order = ngonVertexOrder(positions);
    Eigen::MatrixXd reorderedPositions =
        positions(_order, Eigen::indexing::all);
    Eigen::MatrixXd reorderedAndShiftedPositions =
        reorderedPositions(Eigen::Vector4i{1, 2, 3, 0}, Eigen::indexing::all);
    _polyBasisX = _calcPolyBasis(reorderedPositions);
    _polyBasisY = _calcPolyBasis(reorderedAndShiftedPositions);
  }